

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fifo_cache.hpp
# Opt level: O1

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
cappuccino::
fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::do_find(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *__return_storage_ptr__,
         fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
         *this,unsigned_long *key)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  __node_base_ptr p_Var3;
  _Hash_node_base *p_Var4;
  
  p_Var4 = (_Hash_node_base *)0x0;
  p_Var3 = std::
           _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::_M_find_before_node
                     (&(this->m_keyed_elements)._M_h,
                      *key % (this->m_keyed_elements)._M_h._M_bucket_count,key,*key);
  if (p_Var3 != (__node_base_ptr)0x0) {
    p_Var4 = p_Var3->_M_nxt;
  }
  if (p_Var4 != (_Hash_node_base *)0x0) {
    p_Var1 = p_Var4[2]._M_nxt;
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_dataplus._M_p =
         (pointer)((long)&(__return_storage_ptr__->
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          )._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload + 0x10);
    p_Var2 = p_Var1[4]._M_nxt;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,p_Var2,
               (long)&p_Var2->_M_nxt + (long)&(p_Var1[5]._M_nxt)->_M_nxt);
  }
  (__return_storage_ptr__->
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = p_Var4 != (_Hash_node_base *)0x0;
  return __return_storage_ptr__;
}

Assistant:

auto do_find(const key_type& key) -> std::optional<value_type>
    {
        auto keyed_position = m_keyed_elements.find(key);
        if (keyed_position != m_keyed_elements.end())
        {
            fifo_iterator fifo_position = keyed_position->second;
            element&      e             = *fifo_position;
            return {e.m_value};
        }

        return {};
    }